

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void __thiscall Moc::parseSignals(Moc *this,ClassDef *def)

{
  Token TVar1;
  uint uVar2;
  QTypeRevision QVar3;
  long lVar5;
  byte bVar6;
  long lVar7;
  char *msg;
  long in_FS_OFFSET;
  FunctionDef local_108;
  long local_38;
  uint uVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (this->super_Parser).symbols.d.size;
  lVar7 = (this->super_Parser).index;
  bVar6 = 0xff;
  if ((lVar7 < lVar5) && ((this->super_Parser).symbols.d.ptr[lVar7].token == Q_REVISION_TOKEN)) {
    (this->super_Parser).index = lVar7 + 1;
    QVar3 = parseRevision(this);
    uVar4 = (uint)(ushort)QVar3;
    bVar6 = QVar3.m_majorVersion;
    lVar5 = (this->super_Parser).symbols.d.size;
    lVar7 = (this->super_Parser).index;
  }
  else {
    uVar4 = 0xff;
  }
  if ((lVar5 <= lVar7) || ((this->super_Parser).symbols.d.ptr[lVar7].token != COLON)) {
    Parser::error(&this->super_Parser,(char *)0x0);
  }
  lVar5 = lVar7 + 1;
  (this->super_Parser).index = lVar5;
  if ((def->super_BaseDef).begin <= lVar7) {
    do {
      if (((def->super_BaseDef).end + -1 <= lVar5) || ((this->super_Parser).symbols.d.size <= lVar5)
         ) break;
      (this->super_Parser).index = lVar5 + 1;
      TVar1 = (this->super_Parser).symbols.d.ptr[lVar5].token;
      if ((int)TVar1 < 0x22) {
        if (TVar1 != SEMIC) goto LAB_00128cc3;
      }
      else {
        if ((int)TVar1 < 0x29) {
          if (TVar1 == FRIEND) {
            until(this,SEMIC);
            goto LAB_00128dee;
          }
        }
        else {
          if ((TVar1 - PRIVATE < 3) || (TVar1 - Q_SIGNALS_TOKEN < 2)) {
            (this->super_Parser).index = lVar5;
            break;
          }
          if (TVar1 == USING) {
            msg = "\'using\' directive not supported in \'signals\' section";
            goto LAB_00128e41;
          }
        }
LAB_00128cc3:
        (this->super_Parser).index = lVar5;
        local_108.type.name.d.d = (Data *)0x0;
        local_108.type.name.d.ptr = (char *)0x0;
        local_108.type.name.d.size = 0;
        local_108.type.rawName.d.d = (Data *)0x0;
        local_108.type.rawName.d.ptr = (char *)0x0;
        local_108.type.rawName.d.size = 0;
        local_108.type._48_4_ = 0xaaaaaaa8;
        local_108.type.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i
             = (QFlagsStorageHelper<TypeTag,_4>)0xaaaaaaaa;
        memset(&local_108.type.typeTag,0,0x9c);
        local_108.access = Public;
        parseFunction(this,&local_108,false);
        if (local_108.isVirtual == true) {
          Parser::warning(&this->super_Parser,"Signals cannot be declared virtual");
        }
        if (local_108.inlineCode == true) {
          msg = "Not a signal declaration";
LAB_00128e41:
          Parser::error(&this->super_Parser,msg);
        }
        uVar2 = local_108.revision;
        if ((0 < local_108.revision) ||
           (uVar2 = uVar4 & 0xff | (uint)bVar6 << 8, (bVar6 & (byte)uVar4) != 0xff)) {
          local_108.revision = uVar2;
          def->revisionedMethods = def->revisionedMethods + 1;
        }
        while( true ) {
          QtPrivate::QMovableArrayOps<FunctionDef>::emplace<FunctionDef_const&>
                    ((QMovableArrayOps<FunctionDef> *)&def->signalList,(def->signalList).d.size,
                     &local_108);
          QList<FunctionDef>::end(&def->signalList);
          if ((local_108.arguments.d.size == 0) ||
             (local_108.arguments.d.ptr[local_108.arguments.d.size + -1].isDefault != true)) break;
          local_108.wasCloned = true;
          if ((local_108.arguments.d.d == (Data *)0x0) ||
             (1 < ((local_108.arguments.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i)) {
            QArrayDataPointer<ArgumentDef>::reallocateAndGrow
                      (&local_108.arguments.d,GrowsAtEnd,0,(QArrayDataPointer<ArgumentDef> *)0x0);
          }
          ArgumentDef::~ArgumentDef(local_108.arguments.d.ptr + local_108.arguments.d.size + -1);
          local_108.arguments.d.size = local_108.arguments.d.size + -1;
        }
        FunctionDef::~FunctionDef(&local_108);
      }
LAB_00128dee:
      lVar5 = (this->super_Parser).index;
    } while ((def->super_BaseDef).begin < lVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::parseSignals(ClassDef *def)
{
    QTypeRevision defaultRevision;
    if (test(Q_REVISION_TOKEN))
        defaultRevision = parseRevision();

    next(COLON);
    while (inClass(def) && hasNext()) {
        switch (next()) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case Q_SIGNALS_TOKEN:
        case Q_SLOTS_TOKEN:
            prev();
            return;
        case SEMIC:
            continue;
        case FRIEND:
            until(SEMIC);
            continue;
        case USING:
            error("'using' directive not supported in 'signals' section");
        default:
            prev();
        }
        FunctionDef funcDef;
        funcDef.access = FunctionDef::Public;
        parseFunction(&funcDef);
        if (funcDef.isVirtual)
            warning("Signals cannot be declared virtual");
        if (funcDef.inlineCode)
            error("Not a signal declaration");
        if (funcDef.revision > 0) {
            ++def->revisionedMethods;
        } else if (defaultRevision.isValid()) {
            funcDef.revision = defaultRevision.toEncodedVersion<int>();
            ++def->revisionedMethods;
        }
        def->signalList += funcDef;
        handleDefaultArguments(&def->signalList, funcDef);
    }
}